

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O1

void ImVector_Pair_resizeT(ImVector_Pair *self,int new_size,Pair v)

{
  int iVar1;
  ImGuiStoragePair *pIVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  
  iVar1 = self->Capacity;
  if (iVar1 < new_size) {
    if (iVar1 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar1 / 2 + iVar1;
    }
    if (iVar5 <= new_size) {
      iVar5 = new_size;
    }
    if (iVar1 < iVar5) {
      pIVar2 = (ImGuiStoragePair *)ImGui::MemAlloc((long)iVar5 << 4);
      if (self->Data != (ImGuiStoragePair *)0x0) {
        memcpy(pIVar2,self->Data,(long)self->Size << 4);
        ImGui::MemFree(self->Data);
      }
      self->Data = pIVar2;
      self->Capacity = iVar5;
    }
  }
  iVar1 = self->Size;
  if (iVar1 < new_size) {
    lVar4 = (long)new_size - (long)iVar1;
    uVar3 = (long)iVar1 << 4 | 8;
    do {
      pIVar2 = self->Data;
      *(ImGuiID *)((long)pIVar2 + (uVar3 - 8)) = v.key;
      *(anon_union_8_3_a9ee5d6f_for_ImGuiStoragePair_1 *)((long)&pIVar2->key + uVar3) = v.field_1;
      uVar3 = uVar3 + 0x10;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  self->Size = new_size;
  return;
}

Assistant:

CIMGUI_API void ImVector_Pair_resizeT(ImVector_Pair* self,int new_size,const Pair v)
{
    return self->resize(new_size,v);
}